

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(longlong lhs,
         SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  longlong ret;
  uchar local_22;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_21;
  longlong local_20;
  longlong local_18;
  
  local_20 = 0;
  local_22 = rhs.m_int;
  local_18 = lhs;
  DivisionHelper<long_long,_unsigned_char,_4>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_18,&local_22,&local_20);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>
            (&local_21,&local_20);
  return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         local_21.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}